

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::iterate(CommonEdgeCase *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined2 uVar5;
  CaseType CVar6;
  RenderContext *pRVar7;
  pointer pfVar8;
  TestLog *pTVar9;
  bool bVar10;
  short sVar11;
  short sVar12;
  unsigned_short uVar13;
  int iVar14;
  deUint32 dVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  Surface *surface;
  char *pcVar20;
  size_type sVar21;
  void *__buf;
  bool bVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  int j;
  int iVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  size_type __n;
  int i;
  int iVar31;
  long *plVar32;
  char *__s;
  float fVar33;
  float fVar34;
  vector<unsigned_short,_std::allocator<unsigned_short>_> gridIndices;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> gridPosComps;
  vector<float,_std::allocator<float>_> gridTessParams;
  Surface rendered;
  deUint16 corners [4];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_448;
  deUint32 local_42c;
  RandomViewport local_428;
  vector<float,_std::allocator<float>_> local_418;
  vector<float,_std::allocator<float>_> local_3f8;
  undefined1 *local_3e0;
  TestLog *local_3d8;
  int local_3d0;
  int local_3cc;
  string local_3c8;
  string local_3a8;
  long local_388;
  Surface local_380;
  RenderContext *local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  undefined1 local_338 [8];
  _Alloc_hider local_330;
  char local_320 [16];
  int local_310;
  VertexArrayPointer local_308;
  PrimitiveType local_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  ios_base local_2c0 [8];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  pointer local_2a0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  int local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_3d8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar14 = (*pRVar7->_vptr_RenderContext[4])(pRVar7);
  dVar15 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_428,(RenderTarget *)CONCAT44(extraout_var,iVar14),0x100,0x100,dVar15);
  local_42c = (((this->m_program).m_ptr)->m_program).m_program;
  local_368 = pRVar7;
  iVar14 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  lVar23 = CONCAT44(extraout_var_00,iVar14);
  sVar21 = 0xfffffffffffffff0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    sVar21 = 0x40;
  }
  __n = 0x60;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __n = sVar21;
  }
  local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&local_418,0x32);
  std::vector<float,_std::allocator<float>_>::reserve(&local_3f8,0x19);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve(&local_448,__n);
  iVar14 = 0;
  local_3e0 = local_338;
  iVar31 = 0;
  do {
    fVar33 = ((float)iVar31 + 0.5 + (float)iVar31 + 0.5) / 5.0 + -1.0;
    iVar27 = 0;
    do {
      fVar34 = ((float)iVar27 + 0.5 + (float)iVar27 + 0.5) / 5.0 + -1.0;
      if (local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_338._0_4_ = fVar34;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar34;
        local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_338._0_4_ = fVar33;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar33;
        local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_338._0_4_ = (float)(iVar14 + iVar27) / 24.0;
      if (local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_3f8,
                   (iterator)
                   local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = (float)local_338._0_4_;
        local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar27 = iVar27 + 1;
    } while (iVar27 != 5);
    iVar31 = iVar31 + 1;
    iVar14 = iVar14 + 5;
  } while (iVar31 != 5);
  local_388 = lVar23;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    uVar17 = 0;
    uVar19 = 2;
    iVar14 = 4;
    do {
      local_350 = (ulong)(uint)((int)uVar17 * 5);
      local_358 = (ulong)((int)uVar17 * 5 + 5);
      local_3cc = (int)uVar19;
      uVar29 = 0;
      local_3d0 = iVar14;
      local_360 = uVar17;
      do {
        uVar30 = (int)(uVar29 / 3) * 3;
        local_340 = (ulong)uVar30;
        uVar30 = (int)uVar19 + uVar30;
        sVar11 = (short)uVar29;
        local_338._2_2_ = sVar11 + 1 + (short)local_350;
        local_338._0_2_ = sVar11 + (short)local_350;
        local_338._4_2_ = (short)local_358 + sVar11;
        local_338._6_2_ = (short)local_358 + 1 + sVar11;
        CVar6 = this->m_caseType;
        iVar31 = ((CVar6 == CASETYPE_PRECISE) - 1) + (uint)(CVar6 == CASETYPE_PRECISE);
        if (CVar6 == CASETYPE_BASIC) {
          iVar31 = 0;
        }
        iVar27 = 3;
        local_348 = uVar19;
        do {
          if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_448,
                       (iterator)
                       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_short *)(local_338 + (ulong)(uVar30 % 3) * 2));
          }
          else {
            *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(unsigned_short *)(local_338 + (ulong)(uVar30 % 3) * 2);
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar30 = uVar30 + 1;
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
        iVar31 = iVar31 + iVar14 + (int)local_340;
        iVar27 = 0;
        do {
          if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_448,
                       (iterator)
                       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_short *)(local_338 + (long)((iVar31 + iVar27) % 3) * 2 + 2));
          }
          else {
            *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(unsigned_short *)(local_338 + (long)((iVar31 + iVar27) % 3) * 2 + 2);
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          iVar27 = iVar27 + 1;
        } while (iVar27 != 3);
        uVar30 = (int)uVar29 + 1;
        uVar29 = (ulong)uVar30;
        uVar19 = (ulong)((int)local_348 - 1);
        iVar14 = iVar14 + -1;
      } while (uVar30 != 4);
      uVar30 = (int)local_360 + 1;
      uVar17 = (ulong)uVar30;
      uVar19 = (ulong)(local_3cc + 1);
      iVar14 = local_3d0 + 1;
    } while (uVar30 != 4);
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    iVar14 = 0;
    do {
      iVar31 = 0;
      do {
        sVar11 = 0;
        bVar10 = true;
        do {
          bVar26 = bVar10;
          sVar12 = 0;
          bVar10 = true;
          do {
            bVar22 = bVar10;
            uVar13 = (sVar12 + (short)iVar31 & 1U) +
                     ((sVar11 + (short)iVar14 & 1U) + (short)iVar14) * 5 + (short)iVar31;
            local_338._0_2_ = uVar13;
            if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_448,
                         (iterator)
                         local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_338);
            }
            else {
              *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar13;
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            sVar12 = 1;
            bVar10 = false;
          } while (bVar22);
          sVar11 = 1;
          bVar10 = false;
        } while (bVar26);
        if (((this->m_caseType == CASETYPE_PRECISE) && ((iVar14 + iVar31 & 1U) == 0)) &&
           (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish + -4 <
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish + -1)) {
          lVar16 = (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start +
                   (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish;
          lVar23 = (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start +
                   (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish;
          do {
            lVar1 = lVar16 + -(long)local_448.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined2 *)(lVar1 + -8);
            uVar17 = lVar23 + -4 +
                     -(long)local_448.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start;
            *(undefined2 *)(lVar1 + -8) = *(undefined2 *)(uVar17 + 2);
            *(undefined2 *)(uVar17 + 2) = uVar5;
            lVar16 = lVar16 + 2;
            lVar23 = lVar23 + -2;
          } while (lVar1 - 6U < uVar17);
        }
        iVar31 = iVar31 + 1;
      } while (iVar31 != 4);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 4);
  }
  lVar23 = local_388;
  (**(code **)(local_388 + 0x1a00))(local_428.x,local_428.y,local_428.width,local_428.height);
  (**(code **)(lVar23 + 0x1c0))();
  (**(code **)(lVar23 + 0x1680))(local_42c);
  iVar14 = 3;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    iVar14 = (uint)(this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) * 5 + -1;
  }
  (**(code **)(lVar23 + 0xfd8))(0x8e72,iVar14);
  (**(code **)(lVar23 + 0x188))(0x4000);
  paVar2 = &local_3c8.field_2;
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"in_v_position","");
  pfVar8 = local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1b0._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  pp_Var3 = (_func_int **)(local_1a0 + 8);
  local_1a8 = pp_Var3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_3c8._M_dataplus._M_p,
             local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
  local_188 = 0;
  local_338._0_4_ = local_1b0._0_4_;
  local_330._M_p = local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_1a8,(undefined1 *)(local_1a0._0_8_ + (long)local_1a8));
  local_310 = local_188;
  local_308.componentType = VTX_COMP_FLOAT;
  local_308.convert = VTX_COMP_CONVERT_NONE;
  local_308.numComponents = 2;
  local_308.numElements = 0x19;
  local_308.stride = 0;
  local_308.data = pfVar8;
  if (local_1a8 != pp_Var3) {
    operator_delete(local_1a8,local_1a0._8_8_ + 1);
  }
  paVar4 = &local_3a8.field_2;
  local_3a8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"in_v_tessParam","");
  pfVar8 = local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1b0._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_1a8 = pp_Var3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_3a8._M_dataplus._M_p,
             local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
  local_188 = 0;
  local_2e8 = local_1b0._0_4_;
  plVar32 = local_2d0;
  local_2e0[0] = plVar32;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e0,local_1a8,(undefined1 *)(local_1a0._0_8_ + (long)local_1a8));
  local_2c0[0] = (ios_base)(undefined1)local_188;
  local_2c0[1] = (ios_base)local_188._1_1_;
  local_2c0[2] = (ios_base)local_188._2_1_;
  local_2c0[3] = (ios_base)local_188._3_1_;
  local_2b8 = 8;
  uStack_2b0 = 0x1900000001;
  local_2a8 = 0;
  local_2a0 = pfVar8;
  if (local_1a8 != pp_Var3) {
    operator_delete(local_1a8,local_1a0._8_8_ + 1);
  }
  pRVar7 = local_368;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar4) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_1b0._4_4_ =
       (int)((ulong)((long)local_448.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1);
  local_1b0._0_4_ = 7;
  local_1a8 = (_func_int **)CONCAT44(local_1a8._4_4_,INDEXTYPE_UINT16);
  local_1a0._0_8_ =
       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  glu::draw(pRVar7,local_42c,2,(VertexArrayBinding *)local_338,(PrimitiveList *)local_1b0,
            (DrawUtilCallback *)0x0);
  dVar15 = (**(code **)(local_388 + 0x800))();
  glu::checkError(dVar15,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x71c);
  lVar23 = -0xa0;
  do {
    if (plVar32 != (long *)plVar32[-2]) {
      operator_delete((long *)plVar32[-2],*plVar32 + 1);
    }
    plVar32 = plVar32 + -10;
    lVar23 = lVar23 + 0x50;
  } while (lVar23 != 0);
  getPixels(&local_380,pRVar7,local_428.x,local_428.y,local_428.width,local_428.height);
  local_3c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"RenderedImage","");
  pTVar9 = local_3d8;
  local_3a8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Rendered Image","");
  surface = &local_380;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_3c8,&local_3a8,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar9,__buf,(size_t)surface);
  local_338 = (undefined1  [8])pTVar9;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,
             "Note: coloring is done to clarify the positioning and orientation of the ",0x49);
  pcVar20 = (char *)0x0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar20 = "quads";
  }
  __s = "triangles";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __s = pcVar20;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_330 + (int)*(undefined8 *)(local_330._M_p + -0x18))
    ;
  }
  else {
    sVar18 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,__s,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,
             "; the color of a vertex corresponds to the index of that vertex in the patch",0x4c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar4) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (this->m_caseType == CASETYPE_PRECISE) {
    local_338 = (undefined1  [8])pTVar9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,
               "Note: the \'precise\' qualifier is used to avoid cracks between primitives",0x48);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_caseType != CASETYPE_BASIC) goto LAB_0140741f;
    local_338 = (undefined1  [8])pTVar9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,
               "Note: each shared vertex has the same index among the primitives it belongs to",0x4e
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
LAB_0140741f:
  iVar14 = (int)((float)local_380.m_height * 0.15);
  iVar31 = (int)((float)local_380.m_height * 0.85);
  if (iVar14 < iVar31) {
    iVar27 = (int)((float)local_380.m_width * 0.85);
    iVar24 = (int)((float)local_380.m_width * 0.15);
    iVar25 = iVar14 * local_380.m_width;
    do {
      iVar28 = iVar24;
      if (iVar24 < iVar27) {
        do {
          if ((*(uint *)((long)local_380.m_pixels.m_ptr + (long)(iVar25 + iVar28) * 4) & 0xffffff)
              == 0) {
            local_1b0 = (undefined1  [8])local_3d8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,
                       "Failure: there seem to be cracks in the rendered result",0x37);
            local_338 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,"Note: pixel with zero r, g and b channels found at ",
                       0x33);
            local_3c8._M_dataplus._M_p._4_4_ = iVar14;
            local_3c8._M_dataplus._M_p._0_4_ = iVar28;
            tcu::operator<<((ostream *)&local_330,(Vector<int,_2> *)&local_3c8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
            std::ios_base::~ios_base(local_2c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Image verification failed");
            tcu::Surface::~Surface(&local_380);
            goto LAB_01407629;
          }
          iVar28 = iVar28 + 1;
        } while (iVar27 != iVar28);
      }
      iVar14 = iVar14 + 1;
      iVar25 = iVar25 + local_380.m_width;
    } while (iVar14 != iVar31);
  }
  local_338 = (undefined1  [8])local_3d8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,"Success: there seem to be no cracks in the rendered result",0x3a
            );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  tcu::Surface::~Surface(&local_380);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_01407629:
  if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

CommonEdgeCase::IterateResult CommonEdgeCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	const int					gridWidth				= 4;
	const int					gridHeight				= 4;
	const int					numVertices				= (gridWidth+1)*(gridHeight+1);
	const int					numIndices				= gridWidth*gridHeight * (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3*2 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
	const int					numPosCompsPerVertex	= 2;
	const int					totalNumPosComps		= numPosCompsPerVertex*numVertices;
	vector<float>				gridPosComps;
	vector<float>				gridTessParams;
	vector<deUint16>			gridIndices;

	gridPosComps.reserve(totalNumPosComps);
	gridTessParams.reserve(numVertices);
	gridIndices.reserve(numIndices);

	{
		for (int i = 0; i < gridHeight+1; i++)
		for (int j = 0; j < gridWidth+1; j++)
		{
			gridPosComps.push_back(-1.0f + 2.0f * ((float)j + 0.5f) / (float)(gridWidth+1));
			gridPosComps.push_back(-1.0f + 2.0f * ((float)i + 0.5f) / (float)(gridHeight+1));
			gridTessParams.push_back((float)(i*(gridWidth+1) + j) / (float)(numVertices-1));
		}
	}

	// Generate patch vertex indices.
	// \note If CASETYPE_BASIC, the vertices are ordered such that when multiple
	//		 triangles/quads share a vertex, it's at the same index for everyone.

	if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			const deUint16 corners[4] =
			{
				(deUint16)((i+0)*(gridWidth+1) + j+0),
				(deUint16)((i+0)*(gridWidth+1) + j+1),
				(deUint16)((i+1)*(gridWidth+1) + j+0),
				(deUint16)((i+1)*(gridWidth+1) + j+1)
			};

			const int secondTriangleVertexIndexOffset = m_caseType == CASETYPE_BASIC	? 0
													  : m_caseType == CASETYPE_PRECISE	? 1
													  : -1;
			DE_ASSERT(secondTriangleVertexIndexOffset != -1);

			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+0 + i + (2-j%3)) % 3]);
			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+2 + i + (2-j%3) + secondTriangleVertexIndexOffset) % 3 + 1]);
		}
	}
	else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			// \note The vertices are ordered such that when multiple quads
			//		 share a vertices, it's at the same index for everyone.
			for (int m = 0; m < 2; m++)
			for (int n = 0; n < 2; n++)
				gridIndices.push_back((deUint16)((i+(i+m)%2)*(gridWidth+1) + j+(j+n)%2));

			if(m_caseType == CASETYPE_PRECISE && (i+j) % 2 == 0)
				std::reverse(gridIndices.begin() + (gridIndices.size() - 4),
							 gridIndices.begin() + gridIndices.size());
		}
	}
	else
		DE_ASSERT(false);

	DE_ASSERT((int)gridPosComps.size() == totalNumPosComps);
	DE_ASSERT((int)gridTessParams.size() == numVertices);
	DE_ASSERT((int)gridIndices.size() == numIndices);

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		gl.patchParameteri(GL_PATCH_VERTICES, m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_position", numPosCompsPerVertex, numVertices, 0, &gridPosComps[0]),
			glu::va::Float("in_v_tessParam", 1, numVertices, 0, &gridTessParams[0])
		};

		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches((int)gridIndices.size(), &gridIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface rendered = getPixels(renderCtx, viewport);

		log << TestLog::Image("RenderedImage", "Rendered Image", rendered)
			<< TestLog::Message << "Note: coloring is done to clarify the positioning and orientation of the "
								<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "triangles" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "quads" : DE_NULL)
								<< "; the color of a vertex corresponds to the index of that vertex in the patch"
								<< TestLog::EndMessage;

		if (m_caseType == CASETYPE_BASIC)
			log << TestLog::Message << "Note: each shared vertex has the same index among the primitives it belongs to" << TestLog::EndMessage;
		else if (m_caseType == CASETYPE_PRECISE)
			log << TestLog::Message << "Note: the 'precise' qualifier is used to avoid cracks between primitives" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		// Ad-hoc result verification - check that a certain rectangle in the image contains no black pixels.

		const int startX	= (int)(0.15f * (float)rendered.getWidth());
		const int endX		= (int)(0.85f * (float)rendered.getWidth());
		const int startY	= (int)(0.15f * (float)rendered.getHeight());
		const int endY		= (int)(0.85f * (float)rendered.getHeight());

		for (int y = startY; y < endY; y++)
		for (int x = startX; x < endX; x++)
		{
			const tcu::RGBA pixel = rendered.getPixel(x, y);

			if (pixel.getRed() == 0 && pixel.getGreen() == 0 && pixel.getBlue() == 0)
			{
				log << TestLog::Message << "Failure: there seem to be cracks in the rendered result" << TestLog::EndMessage
					<< TestLog::Message << "Note: pixel with zero r, g and b channels found at " << tcu::IVec2(x, y) << TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				return STOP;
			}
		}

		log << TestLog::Message << "Success: there seem to be no cracks in the rendered result" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}